

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiler.cpp
# Opt level: O1

void indk::Profiler::doEmit(NeuralNet *object,int flag)

{
  _Rb_tree_iterator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>
  _Var1;
  _Self __tmp;
  _Rb_tree_iterator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>
  _Var2;
  pair<std::_Rb_tree_iterator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>,_std::_Rb_tree_iterator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>_>
  pVar3;
  NeuralNet *local_30;
  NeuralNet *local_28;
  
  local_30 = object;
  pVar3 = std::
          _Rb_tree<indk::NeuralNet_*,_std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>,_std::_Select1st<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>,_std::less<indk::NeuralNet_*>,_std::allocator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>_>
          ::equal_range(&Callbacks._M_t,&local_30);
  _Var1 = pVar3.second._M_node;
  if (pVar3.first._M_node._M_node != _Var1._M_node) {
    do {
      _Var2 = pVar3.first._M_node;
      if (*(int *)&_Var2._M_node[2]._M_parent == flag) {
        local_28 = local_30;
        if (_Var2._M_node[1]._M_right == (_Base_ptr)0x0) {
          std::__throw_bad_function_call();
        }
        (**(code **)(_Var2._M_node + 2))(&_Var2._M_node[1]._M_parent,&local_28);
      }
      pVar3 = (pair<std::_Rb_tree_iterator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>,_std::_Rb_tree_iterator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>_>
               )std::_Rb_tree_increment(_Var2._M_node);
    } while (pVar3.first._M_node._M_node != _Var1._M_node);
  }
  return;
}

Assistant:

void indk::Profiler::doEmit(indk::NeuralNet *object, int flag) {
    auto callback = Callbacks.equal_range(object);
    for (auto it = callback.first; it != callback.second; it++) {
        if (it->second.second == flag) it->second.first(object);
    }
}